

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O2

void __thiscall
Atari::ST::ConcreteMachine::ConcreteMachine
          (ConcreteMachine *this,Target *target,ROMFetcher *rom_fetcher)

{
  AY38910<false> *this_00;
  Observer *pOVar1;
  uint16_t *ram;
  pointer puVar2;
  undefined8 uVar3;
  bool bVar4;
  iterator iVar5;
  undefined4 *puVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  size_type __new_size;
  undefined1 local_110 [52];
  Name rom_name;
  LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false> *local_d8;
  EventDelegate local_d0;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_00582710;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0057d638;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_0057d600;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_0057cd58;
  (this->super_MouseMachine)._vptr_MouseMachine = (_func_int **)&PTR___cxa_pure_virtual_00580b78;
  (this->super_JoystickMachine)._vptr_JoystickMachine =
       (_func_int **)&PTR___cxa_pure_virtual_0057cd70;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roms._M_t._M_impl.super__Rb_tree_header._M_header;
  roms._M_t._M_impl._0_8_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0._vptr_EventDelegate = (_func_int **)target;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&roms);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005822b0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00582378;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_005823c0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005823f8;
  (this->super_MouseMachine)._vptr_MouseMachine = (_func_int **)&DAT_00582410;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00582428;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_00582440;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00582470;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_005824b0;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_005824c8;
  (this->super_InterruptDelegate)._vptr_InterruptDelegate = (_func_int **)&DAT_005824e0;
  (this->super_InterruptDelegate)._vptr_InterruptDelegate = (_func_int **)&DAT_005824f8;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00582510;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00582528;
  (this->super_PortHandler)._vptr_PortHandler = (_func_int **)&PTR_get_port_input_00582540;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00582560;
  (this->super_RangeObserver)._vptr_RangeObserver = (_func_int **)&DAT_00582580;
  CPU::MC68000::ProcessorBase::ProcessorBase(&(this->mc68000_).super_ProcessorBase);
  (this->mc68000_).bus_handler_ = this;
  (this->bus_phase_).super_WrappedInt<HalfCycles>.length_ = 0;
  local_110._32_8_ = &this->video_;
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::JustInTimeActor<>
            ((JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *)local_110._32_8_);
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::JustInTimeActor<>
            (&this->mfp_);
  roms._M_t._M_impl._0_8_ = 500000;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::JustInTimeActor<Cycles>
            (&this->keyboard_acia_,(Cycles *)&roms);
  local_110._40_8_ = &this->midi_acia_;
  roms._M_t._M_impl._0_8_ = 500000;
  local_110._24_8_ = &this->keyboard_acia_;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::JustInTimeActor<Cycles>
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_110._40_8_,
             (Cycles *)&roms);
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  this_00 = &this->ay_;
  GI::AY38910::AY38910<false>::AY38910SampleSource(this_00,YM2149F,&this->audio_queue_);
  local_d8 = &(this->speaker_).
              super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>;
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass
            ((PullLowpass<GI::AY38910::AY38910<false>_> *)local_d8,this_00);
  (this->cycles_since_audio_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  local_110._16_8_ = &this->dma_;
  JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::JustInTimeActor<>
            ((JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1> *)local_110._16_8_);
  (this->cycles_since_ikbd_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)&roms);
  uVar3 = roms._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)&request);
  IntelligentKeyboard::IntelligentKeyboard
            (&this->ikbd_,(Line<false> *)(uVar3 + 0x120),(Line<false> *)(request.node._8_8_ + 0x18))
  ;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->rom_start_ = 0;
  this->may_defer_acias_ = true;
  this->keyboard_needs_clock_ = false;
  this->mfp_is_realtime_ = false;
  this->dma_clocking_preference_ = None;
  this->video_interrupts_pending_ = 0;
  this->previous_hsync_ = false;
  this->previous_vsync_ = false;
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_00582be8;
  (this->super_TimedMachine).clock_rate_ = 8021247.0;
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
  ::set_input_rate(local_d8,2005311.8);
  __new_size = 0x400000;
  if (*(MemorySize *)(local_d0._vptr_EventDelegate + 0x11) != FourMegabytes) {
    __new_size = (ulong)(*(MemorySize *)(local_d0._vptr_EventDelegate + 0x11) == OneMegabyte) *
                 0x80000 + 0x80000;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->ram_,__new_size);
  Memory::Fuzz<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&this->ram_);
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::operator->
            ((JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *)&roms);
  ram = (uint16_t *)
        (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  ST::Video::set_ram((Video *)roms._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,ram,
                     (ulong)((long)(this->ram_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ram) >> 1);
  std::
  unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 *)&roms);
  rom_name = AtariSTTOS100;
  ROM::Request::Request(&request,AtariSTTOS100,false);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()(&roms,rom_fetcher,&request);
  bVar4 = ROM::Request::validate(&request,&roms);
  if (!bVar4) {
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0;
    __cxa_throw(puVar6,&ROMMachine::Error::typeinfo,0);
  }
  iVar5 = std::
          _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&roms._M_t,&rom_name);
  Memory::PackBigEndian16
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&iVar5._M_node[1]._M_parent,
             &this->rom_);
  pOVar1 = &this->super_Observer;
  puVar2 = (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  uVar10 = 0;
  uVar8 = uVar7 >> 0x10 & 0xffffffff;
  if ((int)(uVar7 >> 0x10) < 1) {
    uVar8 = uVar10;
  }
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    this->memory_map_[uVar10] = RAM;
  }
  for (; uVar8 < 0x40; uVar8 = uVar8 + 1) {
    this->memory_map_[uVar8] = Floating;
  }
  for (; uVar8 < 0xff; uVar8 = uVar8 + 1) {
    this->memory_map_[uVar8] = Unassigned;
  }
  this->rom_start_ = 0xfc0000;
  for (lVar9 = 0xa5d; lVar9 != 0xa60; lVar9 = lVar9 + 1) {
    *(undefined4 *)((long)&(this->super_Machine)._vptr_Machine + lVar9 * 4) = 2;
  }
  this->memory_map_[0xfa] = Cartridge;
  this->memory_map_[0xfb] = Cartridge;
  this->memory_map_[0xff] = IO;
  *(undefined8 *)puVar2 =
       *(undefined8 *)
        (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_110);
  Motorola::ACIA::ACIA::set_interrupt_delegate
            ((ACIA *)local_110._8_8_,&this->super_InterruptDelegate);
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_110);
  Motorola::ACIA::ACIA::set_interrupt_delegate
            ((ACIA *)local_110._8_8_,&this->super_InterruptDelegate);
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_110);
  (((DeferredQueue<HalfCycles> *)local_110._8_8_)->pending_actions_).
  super__Vector_base<DeferredQueue<HalfCycles>::DeferredAction,_std::allocator<DeferredQueue<HalfCycles>::DeferredAction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pOVar1;
  ClockingHint::Source::update_clocking_observer((Source *)local_110._8_8_);
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_110);
  (((DeferredQueue<HalfCycles> *)local_110._8_8_)->pending_actions_).
  super__Vector_base<DeferredQueue<HalfCycles>::DeferredAction,_std::allocator<DeferredQueue<HalfCycles>::DeferredAction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pOVar1;
  ClockingHint::Source::update_clocking_observer((Source *)local_110._8_8_);
  (this->ikbd_).super_Source.observer_ = pOVar1;
  ClockingHint::Source::update_clocking_observer(&(this->ikbd_).super_Source);
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::operator->
            ((JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *)local_110
            );
  (((DeferredQueue<HalfCycles> *)local_110._8_8_)->pending_actions_).
  super__Vector_base<DeferredQueue<HalfCycles>::DeferredAction,_std::allocator<DeferredQueue<HalfCycles>::DeferredAction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pOVar1;
  ClockingHint::Source::update_clocking_observer((Source *)local_110._8_8_);
  std::
  unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                 *)local_110);
  JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::operator->
            ((JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1> *)local_110);
  (((DeferredQueue<HalfCycles> *)local_110._8_8_)->pending_actions_).
  super__Vector_base<DeferredQueue<HalfCycles>::DeferredAction,_std::allocator<DeferredQueue<HalfCycles>::DeferredAction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pOVar1;
  ClockingHint::Source::update_clocking_observer
            ((Source *)
             &(((DeferredQueue<HalfCycles> *)local_110._8_8_)->pending_actions_).
              super__Vector_base<DeferredQueue<HalfCycles>::DeferredAction,_std::allocator<DeferredQueue<HalfCycles>::DeferredAction>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::operator->
            ((JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *)local_110
            );
  Motorola::MFP68901::MFP68901::set_interrupt_delegate
            ((MFP68901 *)local_110._8_8_,&this->super_InterruptDelegate);
  std::
  unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                 *)local_110);
  JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::operator->
            ((JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1> *)local_110);
  DMAController::set_delegate((DMAController *)local_110._8_8_,&this->super_Delegate);
  GI::AY38910::AY38910SampleSource<false>::set_port_handler
            (&this_00->super_AY38910SampleSource<false>,&this->super_PortHandler);
  set_gpip_input(this);
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::operator->
            ((JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *)local_110);
  ST::Video::set_range_observer((Video *)local_110._8_8_,&this->super_RangeObserver);
  std::
  unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 *)local_110);
  insert_media(this,(Media *)(local_d0._vptr_EventDelegate + 3));
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&roms._M_t);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&request.node.children);
  return;
}

Assistant:

ConcreteMachine(const Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			mc68000_(*this),
			keyboard_acia_(Cycles(500000)),
			midi_acia_(Cycles(500000)),
			ay_(GI::AY38910::Personality::YM2149F, audio_queue_),
			speaker_(ay_),
			ikbd_(keyboard_acia_->transmit, keyboard_acia_->receive) {
			set_clock_rate(CLOCK_RATE);
			speaker_.set_input_rate(float(CLOCK_RATE) / 4.0f);

			switch(target.memory_size) {
				default:
				case Target::MemorySize::FiveHundredAndTwelveKilobytes:
					ram_.resize(512 * 1024);
				break;
				case Target::MemorySize::OneMegabyte:
					ram_.resize(1024 * 1024);
				break;
				case Target::MemorySize::FourMegabytes:
					ram_.resize(4 * 1024 * 1024);
				break;
			}
			Memory::Fuzz(ram_);

			video_->set_ram(
				reinterpret_cast<uint16_t *>(ram_.data()),
				ram_.size() >> 1
			);

			constexpr ROM::Name rom_name = ROM::Name::AtariSTTOS100;
			ROM::Request request(rom_name);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}
			Memory::PackBigEndian16(roms.find(rom_name)->second, rom_);

			// Set up basic memory map.
			int c = 0;
			for(; c < int(ram_.size() >> 16); ++c) memory_map_[c] = BusDevice::RAM;
			for(; c < 0x40; ++c) memory_map_[c] = BusDevice::Floating;
			for(; c < 0xff; ++c) memory_map_[c] = BusDevice::Unassigned;

			const bool is_early_tos = true;
			if(is_early_tos) {
				rom_start_ = 0xfc0000;
				for(c = 0xfc; c < 0xff; ++c) memory_map_[c] = BusDevice::ROM;
			} else {
				rom_start_ = 0xe00000;
				for(c = 0xe0; c < 0xe4; ++c) memory_map_[c] = BusDevice::ROM;
			}

			memory_map_[0xfa] = memory_map_[0xfb] = BusDevice::Cartridge;
			memory_map_[0xff] = BusDevice::IO;

			// Copy the first 8 bytes of ROM into RAM.
			reinstall_rom_vector();

			midi_acia_->set_interrupt_delegate(this);
			keyboard_acia_->set_interrupt_delegate(this);

			midi_acia_->set_clocking_hint_observer(this);
			keyboard_acia_->set_clocking_hint_observer(this);
			ikbd_.set_clocking_hint_observer(this);
			mfp_->set_clocking_hint_observer(this);
			dma_->set_clocking_hint_observer(this);

			mfp_->set_interrupt_delegate(this);
			dma_->set_delegate(this);
			ay_.set_port_handler(this);

			set_gpip_input();

			video_->set_range_observer(this);

			// Insert any supplied media.
			insert_media(target.media);
		}